

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

xmlStreamCompPtr xmlNewStreamComp(int size)

{
  xmlStreamCompPtr pxVar1;
  xmlStreamStepPtr pxVar2;
  uint uVar3;
  
  uVar3 = 4;
  if (4 < size) {
    uVar3 = size;
  }
  pxVar1 = (xmlStreamCompPtr)(*xmlMalloc)(0x20);
  if (pxVar1 != (xmlStreamCompPtr)0x0) {
    pxVar1->steps = (xmlStreamStepPtr)0x0;
    *(undefined8 *)&pxVar1->flags = 0;
    pxVar1->dict = (xmlDict *)0x0;
    pxVar1->nbStep = 0;
    pxVar1->maxStep = 0;
    pxVar2 = (xmlStreamStepPtr)(*xmlMalloc)((ulong)uVar3 << 5);
    pxVar1->steps = pxVar2;
    if (pxVar2 != (xmlStreamStepPtr)0x0) {
      pxVar1->nbStep = 0;
      pxVar1->maxStep = uVar3;
      return pxVar1;
    }
    (*xmlFree)(pxVar1);
  }
  return (xmlStreamCompPtr)0x0;
}

Assistant:

static xmlStreamCompPtr
xmlNewStreamComp(int size) {
    xmlStreamCompPtr cur;

    if (size < 4)
        size  = 4;

    cur = (xmlStreamCompPtr) xmlMalloc(sizeof(xmlStreamComp));
    if (cur == NULL) {
	ERROR(NULL, NULL, NULL,
		"xmlNewStreamComp: malloc failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlStreamComp));
    cur->steps = (xmlStreamStepPtr) xmlMalloc(size * sizeof(xmlStreamStep));
    if (cur->steps == NULL) {
	xmlFree(cur);
	ERROR(NULL, NULL, NULL,
	      "xmlNewStreamComp: malloc failed\n");
	return(NULL);
    }
    cur->nbStep = 0;
    cur->maxStep = size;
    return(cur);
}